

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O0

dw_dungeon_tile get_dungeon_tile(dw_rom *rom,dw_map_index town,uint8_t x,uint8_t y)

{
  BOOL BVar1;
  ulong uVar2;
  long lVar3;
  byte local_29;
  uint8_t tile;
  size_t data_addr;
  size_t offset;
  uint8_t y_local;
  uint8_t x_local;
  dw_map_index town_local;
  dw_rom *rom_local;
  
  uVar2 = (ulong)y * (long)(int)((rom->map).meta[town].width + 1) + (ulong)x;
  lVar3 = (long)(int)(*(ushort *)(rom->map).meta[town].pointer & 0x7fff) + (uVar2 >> 1);
  if ((uVar2 & 1) == 0) {
    local_29 = (byte)((int)(uint)rom->content[lVar3] >> 4);
  }
  else {
    local_29 = rom->content[lVar3] & 0xf;
  }
  BVar1 = contains_roof_data(town);
  if (BVar1 != FALSE) {
    local_29 = local_29 & 7;
  }
  return (dw_dungeon_tile)local_29;
}

Assistant:

dw_dungeon_tile get_dungeon_tile(dw_rom *rom, dw_map_index town, uint8_t x,
        uint8_t y)
{
    size_t offset = (size_t)y * (rom->map.meta[town].width+1) + x;
    size_t data_addr = ((*(uint16_t*)(&rom->map.meta[town].pointer)) & 0x7fff) +
        offset/2;
    uint8_t tile;

    if (offset % 2) {
        tile = rom->content[data_addr] & 0x0f;
    } else {
        tile = rom->content[data_addr] >> 4;
    }

    if (contains_roof_data(town)) {
        tile &= 0x7;
    }

    return (dw_dungeon_tile)tile;
}